

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall
Lodtalk::StackInterpreter::pushLongReceiverVariable(StackInterpreter *this,size_t receiverVarIndex)

{
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar4;
  uint8_t *puVar5;
  Oop OVar6;
  Oop value;
  undefined1 local_70 [8];
  StackFrame previousFrame;
  uint8_t *prevFP;
  StackFrame contextFrame;
  uint8_t *contextFP;
  Context *context;
  size_t receiverVarIndex_local;
  StackInterpreter *this_local;
  
  if (receiverVarIndex < 6) {
    paVar4 = &currentReceiver(this)->field_0;
    iVar3 = classIndexOf((Oop)*paVar4);
    if (iVar3 == 0x5c) {
      paVar4 = &currentReceiver(this)->field_0;
      OVar6.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)paVar4->header;
      bVar2 = Context::isMarriedOrWidowed((Context *)OVar6.field_0);
      if (!bVar2) {
        pushReceiverVariable(this,receiverVarIndex);
        return;
      }
      contextFrame.stackPointer =
           (uint8_t *)
           (((anon_union_8_4_0eb573b0_for_Oop_0 *)((long)OVar6.field_0 + 8))->uintValue + -1);
      StackFrame::StackFrame((StackFrame *)&prevFP,contextFrame.stackPointer,(uint8_t *)0x0);
      puVar5 = StackFrame::getPrevFramePointer((StackFrame *)&prevFP);
      puVar1 = contextFrame.stackPointer;
      if (receiverVarIndex == 0) {
        if (puVar5 == (uint8_t *)0x0) {
          OVar6 = nilOop();
          pushOop(this,OVar6);
        }
        else {
          StackFrame::getPreviousFrame((StackFrame *)local_70);
          StackFrame::ensureFrameIsMarried((StackFrame *)local_70,this->context);
          paVar4 = &StackFrame::getThisContext((StackFrame *)local_70)->field_0;
          pushOop(this,(Oop)*paVar4);
          StackFrame::~StackFrame((StackFrame *)local_70);
        }
        bVar2 = true;
      }
      else if ((receiverVarIndex == 1) &&
              (puVar5 = StackMemory::getFramePointer(this->stack), puVar1 == puVar5)) {
        pushSmallIntegerObject(this,this->pc);
        bVar2 = true;
      }
      else {
        getInstanceVariable(this,receiverVarIndex);
        bVar2 = false;
      }
      StackFrame::~StackFrame((StackFrame *)&prevFP);
      if (bVar2) {
        return;
      }
    }
  }
  pushReceiverVariable(this,receiverVarIndex);
  return;
}

Assistant:

void pushLongReceiverVariable(size_t receiverVarIndex)
    {
        if(receiverVarIndex <= 5 && classIndexOf(currentReceiver()) == SCI_Context)
        {
            auto context = reinterpret_cast<Context*> (currentReceiver().pointer);
            if (!context->isMarriedOrWidowed())
                return pushReceiverVariable(receiverVarIndex);

            // TODO: Perform expensive check for widowed context.
            auto contextFP = context->sender.pointer - 1;
            StackFrame contextFrame(contextFP);
            auto prevFP = contextFrame.getPrevFramePointer();

            switch (receiverVarIndex)
            {
            case Context::SenderIndex:
            {
                if (!prevFP)
                {
                    pushOop(nilOop());
                }
                else
                {
                    auto previousFrame = contextFrame.getPreviousFrame();
                    previousFrame.ensureFrameIsMarried(this->context);
                    pushOop(previousFrame.getThisContext());
                }
                return;
            }
                break;
            case Context::PCIndex:
                if (contextFP == stack->getFramePointer())
                    return pushSmallIntegerObject(pc);
                break;
            case Context::StackPointerIndex:
                break;
            }
            auto value = getInstanceVariable(receiverVarIndex);
            //printf("get context var %d %p\n", (int)receiverVarIndex, value.pointer);
        }

        pushReceiverVariable(receiverVarIndex);
    }